

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool Imf_3_4::checkOpenEXRFile(char *fileName,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  __type _Var5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  uint *puVar10;
  Header *pHVar11;
  undefined7 in_register_00000009;
  ulong uVar12;
  bool reduceTime_00;
  bool reduceTime_01;
  bool reduceTime_02;
  ulong uVar13;
  int iVar14;
  int maxTileHeight;
  int maxTileWidth;
  int maxImageHeight;
  int maxImageWidth;
  exr_context_t f;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  MultiPartInputFile multi;
  
  if ((int)CONCAT71(in_register_00000009,runCoreCheck) != 0) {
    _multi = 0x68;
    iVar8 = exr_start_read(&f,fileName,&multi);
    if (iVar8 != 0) {
      return true;
    }
    bVar3 = anon_unknown_0::checkCoreFile(f,reduceMemory,reduceTime);
    exr_finish(&f);
    return bVar3;
  }
  lVar9 = Imf_3_4::CompositeDeepScanLine::getMaximumSampleCount();
  Imf_3_4::Header::getMaxImageSize(&maxImageWidth,&maxImageHeight);
  Imf_3_4::Header::getMaxImageSize(&maxTileWidth,&maxTileHeight);
  if (reduceTime || reduceMemory) {
    Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(0x100000);
    Imf_3_4::Header::setMaxImageSize(0x800,0x800);
    iVar14 = 0x200;
    iVar8 = 0x200;
  }
  else {
    iVar14 = 0x4000;
    iVar8 = 0x4000;
  }
  Imf_3_4::Header::setMaxTileSize(iVar14,iVar8);
  f = (exr_context_t)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  iVar8 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(&multi,fileName,iVar8,true);
  Imf_3_4::MultiPartInputFile::header((int)&multi);
  Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&f);
  cVar4 = Imf_3_4::isTiled((string *)&f);
  if (cVar4 == '\0') {
    bVar3 = false;
  }
  else {
    Imf_3_4::MultiPartInputFile::header((int)&multi);
    puVar10 = (uint *)Imf_3_4::Header::tileDescription();
    uVar1 = *puVar10;
    uVar2 = puVar10[1];
    pHVar11 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&multi);
    iVar8 = Imf_3_4::calculateBytesPerPixel(pHVar11);
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            DEEPTILE_abi_cxx11_);
    uVar12 = (ulong)iVar8;
    uVar13 = 4;
    if (4 < uVar12) {
      uVar13 = uVar12;
    }
    if (!_Var5) {
      uVar13 = uVar12;
    }
    bVar3 = 1000000 < uVar13 * (ulong)uVar2 * (ulong)uVar1;
  }
  bVar6 = anon_unknown_0::readMultiPart(&multi,reduceMemory,reduceTime);
  MultiPartInputFile::~MultiPartInputFile(&multi);
  if (reduceMemory) {
    if (bVar3) goto LAB_00110d58;
  }
  else {
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&multi,fileName,iVar8);
    bVar7 = anon_unknown_0::readRgba((RgbaInputFile *)&multi,reduceTime,reduceTime_00);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&multi);
    if (bVar7) {
      bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)DEEPTILE_abi_cxx11_);
      bVar6 = bVar6 || bVar7;
    }
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile((InputFile *)&multi,fileName,iVar8);
    bVar7 = anon_unknown_0::readScanline<Imf_3_4::InputFile>
                      ((InputFile *)&multi,reduceTime,reduceTime_01);
    InputFile::~InputFile((InputFile *)&multi);
    if (bVar7) {
      bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)DEEPTILE_abi_cxx11_);
      bVar6 = (bool)(bVar6 | bVar7);
    }
  }
  iVar8 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&multi,fileName,iVar8);
  bVar7 = anon_unknown_0::readTile<Imf_3_4::TiledInputFile>
                    ((TiledInputFile *)&multi,reduceMemory,reduceTime);
  TiledInputFile::~TiledInputFile((TiledInputFile *)&multi);
  if (bVar7) {
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            TILEDIMAGE_abi_cxx11_);
    bVar6 = (bool)(bVar6 | _Var5);
  }
  if (reduceMemory) {
    if (bVar3) goto LAB_00110d58;
  }
  else {
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&multi,fileName,iVar8);
    bVar3 = anon_unknown_0::readDeepScanLine<Imf_3_4::DeepScanLineInputFile>
                      ((DeepScanLineInputFile *)&multi,reduceTime,reduceTime_02);
    DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&multi);
    if (bVar3) {
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)DEEPSCANLINE_abi_cxx11_);
      bVar6 = (bool)(bVar6 | _Var5);
    }
  }
  iVar8 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)&multi,fileName,iVar8);
  bVar3 = anon_unknown_0::readDeepTile<Imf_3_4::DeepTiledInputFile>
                    ((DeepTiledInputFile *)&multi,reduceMemory,reduceTime);
  DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)&multi);
  if (bVar3) {
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            DEEPTILE_abi_cxx11_);
    bVar6 = (bool)(bVar6 | _Var5);
  }
LAB_00110d58:
  Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(lVar9);
  Imf_3_4::Header::setMaxImageSize(maxImageWidth,maxImageHeight);
  Imf_3_4::Header::setMaxTileSize(maxTileWidth,maxTileHeight);
  std::__cxx11::string::~string((string *)&f);
  return bVar6;
}

Assistant:

bool
checkOpenEXRFile (
    const char* fileName, bool reduceMemory, bool reduceTime, bool runCoreCheck)
{

    if (runCoreCheck)
    {
        return runCoreChecks (fileName, reduceMemory, reduceTime);
    }
    else { return runChecks (fileName, reduceMemory, reduceTime); }
}